

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O2

result * baryonyx::itm::manual_optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  double dVar1;
  bool bVar2;
  double local_2b0;
  __array best_params;
  double best;
  manual_course array;
  context internal;
  result local_d8;
  
  notice<>(ctx,"- auto-tune parameters (manual) starts\n");
  manual_course::manual_course
            (&array,(ctx->parameters).theta,(ctx->parameters).delta,(ctx->parameters).kappa_min,
             (ctx->parameters).kappa_step,(ctx->parameters).init_policy_random,5);
  context::context(&internal,ctx);
  internal.log_priority = warning;
  std::make_unique<int[]>((size_t)&best_params);
  best = INFINITY;
  local_2b0 = INFINITY;
  do {
    internal.parameters.theta =
         *(double *)
          ((long)array.theta._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                 .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)array.iterators._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                        ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl * 8);
    internal.parameters.delta =
         *(double *)
          ((long)array.delta._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                 .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)((long)array.iterators._M_t.
                               super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) * 8);
    internal.parameters.kappa_min =
         *(double *)
          ((long)array.kappa_min._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)((long)array.iterators._M_t.
                               super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 8) * 8);
    internal.parameters.kappa_step =
         *(double *)
          ((long)array.kappa_step._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                 ._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)((long)array.iterators._M_t.
                               super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xc) * 8);
    internal.parameters.init_policy_random =
         *(double *)
          ((long)array.init_policy_random._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)((long)array.iterators._M_t.
                               super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x10) * 8);
    notice<double,double,double,double,double>
              (&internal,
               "  - optimization with theta:{} delta:{} kappa-min:{} kappa-step:{} init-policy-random: {}"
               ,&internal.parameters.theta,&internal.parameters.delta,&internal.parameters.kappa_min
               ,&internal.parameters.kappa_step,&internal.parameters.init_policy_random);
    optimize(&local_d8,&internal,pb);
    if (local_d8.status == success) {
      notice<double>(&internal,"{:f}\n",
                     &local_d8.solutions.
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].value);
      dVar1 = local_d8.solutions.
              super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].value;
      if ((dVar1 < local_2b0) && (local_2b0 = dVar1, best = dVar1, 0 < (long)array.length)) {
        memmove((void *)best_params._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                        _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl,
                (void *)array.iterators._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                        ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl,(long)array.length << 2);
      }
    }
    else {
      notice<>(&internal,"no solution\n");
    }
    result::~result(&local_d8);
    bVar2 = manual_course::next(&array);
  } while (bVar2);
  notice<double,double,double,double,double,double>
            (&internal,
             "  - manual optimization found solution {:f}: with theta:{} delta:{} kappa-min:{} kappa-step:{} init-random:{}\n"
             ,&best,(double *)
                    ((long)*(int *)array.iterators._M_t.
                                   super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                   super__Head_base<0UL,_int_*,_false>._M_head_impl * 8 +
                    (long)array.theta._M_t.
                          super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                          super__Head_base<0UL,_double_*,_false>._M_head_impl),
             (double *)
             ((long)*(int *)((long)array.iterators._M_t.
                                   super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                   super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) * 8 +
             (long)array.delta._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                   _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl),
             (double *)
             ((long)*(int *)((long)array.iterators._M_t.
                                   super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                   super__Head_base<0UL,_int_*,_false>._M_head_impl + 8) * 8 +
             (long)array.kappa_min._M_t.
                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl),
             (double *)
             ((long)*(int *)((long)array.iterators._M_t.
                                   super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                   super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xc) * 8 +
             (long)array.kappa_step._M_t.
                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl),
             (double *)
             ((long)*(int *)((long)array.iterators._M_t.
                                   super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                   super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x10) * 8 +
             (long)array.init_policy_random._M_t.
                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl));
  optimize(__return_storage_ptr__,&internal,pb);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&best_params);
  context::~context(&internal);
  manual_course::~manual_course(&array);
  return __return_storage_ptr__;
}

Assistant:

result
manual_optimize(const baryonyx::context& ctx, const baryonyx::problem& pb)
{
    baryonyx::notice(ctx, "- auto-tune parameters (manual) starts\n");
    return ::optimize(ctx, pb);
}